

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

void pzshape::TPZShapeLinear::ShapeOrder
               (TPZVec<long> *id,TPZVec<int> *order,TPZGenMatrix<int> *shapeorders)

{
  uint uVar1;
  int *piVar2;
  long i;
  
  uVar1 = *order->fStore;
  if (shapeorders->fRows != (long)(int)uVar1 + 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapelinear.cpp"
               ,0x123);
  }
  piVar2 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
  *piVar2 = 1;
  piVar2 = TPZGenMatrix<int>::operator()(shapeorders,1,0);
  *piVar2 = 1;
  if (1 < (int)uVar1) {
    i = 2;
    do {
      piVar2 = TPZGenMatrix<int>::operator()(shapeorders,i,0);
      *piVar2 = (int)i;
      i = i + 1;
    } while ((ulong)uVar1 + 1 != i);
  }
  return;
}

Assistant:

void TPZShapeLinear::ShapeOrder(const TPZVec<int64_t> &id, const TPZVec<int> &order, TPZGenMatrix<int> &shapeorders)//, TPZVec<int64_t> &sides
    {
        int nshape = 2+(order[0]-1);
        if (shapeorders.Rows() != nshape) {
            DebugStop();
        }
        shapeorders(0,0) = 1;
        shapeorders(1,0) = 1;
        for (int i=2; i<nshape; i++) {
            shapeorders(i,0) = i;
        }
    }